

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall libcellml::UnitsItem::isValid(UnitsItem *this)

{
  int iVar1;
  UnitsItemImpl *pUVar2;
  Units *this_00;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar6;
  
  pUVar2 = this->mPimpl;
  this_01 = (pUVar2->mUnits).super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_01->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar6 = iVar4 == iVar1;
      if (bVar6) {
        this_01->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = this_01->_M_use_count == 0;
  }
  this_00 = (pUVar2->mUnits).super___weak_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((bool)(this_00 == (Units *)0x0 | bVar6)) {
    bVar6 = false;
  }
  else {
    uVar3 = this->mPimpl->mIndex;
    sVar5 = Units::unitCount(this_00);
    bVar6 = uVar3 < sVar5;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return bVar6;
}

Assistant:

bool UnitsItem::isValid() const
{
    auto units = mPimpl->mUnits.lock();
    if (units != nullptr) {
        return mPimpl->mIndex < units->unitCount();
    }

    return false;
}